

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

Am_Value_List * __thiscall Am_Value_List::operator=(Am_Value_List *this,Am_Value *list_value)

{
  uint *puVar1;
  Am_Value_List_Data *this_00;
  Am_Value_List_Data *pAVar2;
  ostream *poVar3;
  
  this_00 = this->data;
  pAVar2 = (Am_Value_List_Data *)(list_value->value).wrapper_value;
  this->data = pAVar2;
  if (pAVar2 != (Am_Value_List_Data *)0x0) {
    if (list_value->type != 1 && Am_Value_List_Data::id != list_value->type) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar3 = std::operator<<(poVar3,"Tried to set a Am_Value_List with a non list value = ");
      poVar3 = ::operator<<(poVar3,list_value);
      std::endl<char,std::char_traits<char>>(poVar3);
      Am_Error();
    }
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  if (this_00 != (Am_Value_List_Data *)0x0) {
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  this->item = (Am_List_Item *)0x0;
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::operator=(const Am_Value &list_value)
{
  Am_Value_List_Data *old_data = data;
  data = (Am_Value_List_Data *)list_value.value.wrapper_value;
  if (data) {
    if (Am_Value_List_Data::Am_Value_List_Data_ID() != list_value.type &&
        list_value.type != Am_ZERO) {
      Am_ERROR("Tried to set a Am_Value_List with a non list value = "
               << list_value);
    }
    data->Note_Reference();
  }
  if (old_data)
    old_data->Release();
  item = nullptr;
  return *this;
}